

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int __thiscall
google::protobuf::io::EpsCopyOutputStream::Flush(EpsCopyOutputStream *this,uint8_t *ptr)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_f2;
  byte local_f1;
  LogMessage local_f0;
  int local_b8;
  LogFinisher local_b2;
  byte local_b1;
  int s;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  int local_24;
  uint8_t *puStack_20;
  int overrun;
  uint8_t *ptr_local;
  EpsCopyOutputStream *this_local;
  
  puStack_20 = ptr;
  ptr_local = (uint8_t *)this;
  do {
    bVar1 = false;
    if (this->buffer_end_ != (uint8_t *)0x0) {
      bVar1 = this->end_ < puStack_20;
    }
    if (!bVar1) {
      if (this->buffer_end_ == (uint8_t *)0x0) {
        local_b8 = ((int)this->end_ + 0x10) - (int)puStack_20;
        this->buffer_end_ = puStack_20;
      }
      else {
        memcpy(this->buffer_end_,this->buffer_,(long)puStack_20 - (long)this->buffer_);
        this->buffer_end_ = this->buffer_end_ + ((long)puStack_20 - (long)this->buffer_);
        local_b8 = (int)this->end_ - (int)puStack_20;
      }
      local_f1 = 0;
      if (local_b8 < 0) {
        internal::LogMessage::LogMessage
                  (&local_f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                   ,700);
        local_f1 = 1;
        pLVar2 = internal::LogMessage::operator<<(&local_f0,"CHECK failed: s >= 0: ");
        internal::LogFinisher::operator=(&local_f2,pLVar2);
      }
      if ((local_f1 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_f0);
      }
      return local_b8;
    }
    local_24 = (int)puStack_20 - (int)this->end_;
    local_61 = 0;
    if ((this->had_error_ & 1U) != 0) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x2ad);
      local_61 = 1;
      pLVar2 = internal::LogMessage::operator<<(&local_60,"CHECK failed: !had_error_: ");
      internal::LogFinisher::operator=(local_75,pLVar2);
    }
    if ((local_61 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_60);
    }
    local_b1 = 0;
    if (0x10 < local_24) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&s,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x2ae);
      local_b1 = 1;
      pLVar2 = internal::LogMessage::operator<<
                         ((LogMessage *)&s,"CHECK failed: overrun <= kSlopBytes: ");
      internal::LogFinisher::operator=(&local_b2,pLVar2);
    }
    if ((local_b1 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)&s);
    }
    puStack_20 = Next(this);
    puStack_20 = puStack_20 + local_24;
  } while ((this->had_error_ & 1U) == 0);
  return 0;
}

Assistant:

int EpsCopyOutputStream::Flush(uint8_t* ptr) {
  while (buffer_end_ && ptr > end_) {
    int overrun = ptr - end_;
    GOOGLE_DCHECK(!had_error_);
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
    if (had_error_) return 0;
  }
  int s;
  if (buffer_end_) {
    std::memcpy(buffer_end_, buffer_, ptr - buffer_);
    buffer_end_ += ptr - buffer_;
    s = end_ - ptr;
  } else {
    // The stream is writing directly in the ZeroCopyOutputStream buffer.
    s = end_ + kSlopBytes - ptr;
    buffer_end_ = ptr;
  }
  GOOGLE_DCHECK(s >= 0);  // NOLINT
  return s;
}